

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

SplitTxOutRequestStruct * __thiscall
cfd::js::api::json::SplitTxOutRequest::ConvertToStruct
          (SplitTxOutRequestStruct *__return_storage_ptr__,SplitTxOutRequest *this)

{
  _Rb_tree_header *p_Var1;
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  local_50;
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  local_38;
  
  (__return_storage_ptr__->tx)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->tx).field_2;
  (__return_storage_ptr__->tx)._M_string_length = 0;
  (__return_storage_ptr__->tx).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->is_elements = false;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&__return_storage_ptr__->index = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->txouts).
           super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (__return_storage_ptr__->txouts).
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->txouts).
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->is_elements = this->is_elements_;
  __return_storage_ptr__->index = this->index_;
  core::JsonObjectVector<cfd::js::api::json::SplitTxOutData,_cfd::js::api::SplitTxOutDataStruct>::
  ConvertToStruct(&local_50,&this->txouts_);
  local_38.
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->txouts).
       super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->txouts).
       super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->txouts).
       super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->txouts).
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_50.
       super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->txouts).
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_50.
       super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->txouts).
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_50.
       super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  ~vector(&local_38);
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  ~vector(&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SplitTxOutRequestStruct SplitTxOutRequest::ConvertToStruct() const {  // NOLINT
  SplitTxOutRequestStruct result;
  result.tx = tx_;
  result.is_elements = is_elements_;
  result.index = index_;
  result.txouts = txouts_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}